

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

duckdb_value duckdb_create_decimal(duckdb_decimal input)

{
  bool bVar1;
  Value *__return_storage_ptr__;
  int64_t *in_RCX;
  uint8_t in_R9B;
  hugeint_t value;
  hugeint_t input_00;
  int64_t int64;
  
  input_00.upper = (int64_t)&int64;
  input_00.lower = input.value.upper;
  bVar1 = duckdb::Hugeint::TryCast<long>((Hugeint *)input.value.lower,input_00,in_RCX);
  __return_storage_ptr__ = (Value *)operator_new(0x40);
  if (bVar1) {
    duckdb::Value::DECIMAL(__return_storage_ptr__,int64,input.width,input.scale);
  }
  else {
    value.upper._0_1_ = input.width;
    value.lower = input.value.upper;
    value.upper._1_7_ = 0;
    duckdb::Value::DECIMAL
              (__return_storage_ptr__,(Value *)input.value.lower,value,input.scale,in_R9B);
  }
  return (duckdb_value)__return_storage_ptr__;
}

Assistant:

duckdb_value duckdb_create_decimal(duckdb_decimal input) {
	duckdb::hugeint_t hugeint(input.value.upper, input.value.lower);
	int64_t int64;
	if (duckdb::Hugeint::TryCast<int64_t>(hugeint, int64)) {
		// The int64 DECIMAL value constructor will select the appropriate physical type based on width.
		return WrapValue(new duckdb::Value(duckdb::Value::DECIMAL(int64, input.width, input.scale)));
	} else {
		// The hugeint DECIMAL value constructor always uses a physical hugeint, and requires width >= MAX_WIDTH_INT64.
		return WrapValue(new duckdb::Value(duckdb::Value::DECIMAL(hugeint, input.width, input.scale)));
	}
}